

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedSnapshotRecord.cpp
# Opt level: O0

void __thiscall
cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView
          (CompressedSnapshotRecordView *this,uchar *buf,size_t *inc)

{
  ulong local_38;
  size_t i_1;
  size_t i;
  size_t pos;
  size_t *inc_local;
  uchar *buf_local;
  CompressedSnapshotRecordView *this_local;
  
  this->m_buffer = buf;
  i = 1;
  this->m_num_nodes = (ulong)*buf;
  pos = (size_t)inc;
  inc_local = (size_t *)buf;
  buf_local = (uchar *)this;
  for (i_1 = 0; i_1 < this->m_num_nodes; i_1 = i_1 + 1) {
    vldec_u64((uchar *)((long)inc_local + i),&i);
  }
  this->m_imm_len = 0;
  this->m_imm_pos = i;
  this->m_num_imm = (ulong)*(byte *)((long)inc_local + i);
  i = i + 1;
  for (local_38 = 0; local_38 < this->m_num_imm; local_38 = local_38 + 1) {
    vldec_u64((uchar *)((long)inc_local + i),&i);
    Variant::unpack((uchar *)((long)inc_local + i),&i,(bool *)0x0);
  }
  this->m_imm_len = i - this->m_imm_pos;
  *(size_t *)pos = i + *(long *)pos;
  return;
}

Assistant:

CompressedSnapshotRecordView::CompressedSnapshotRecordView(const unsigned char* buf, size_t* inc) : m_buffer(buf)
{
    size_t pos = 0;

    m_num_nodes = buf[pos++];

    for (size_t i = 0; i < m_num_nodes; ++i)
        vldec_u64(buf + pos, &pos);

    m_imm_len = 0;
    m_imm_pos = pos;
    m_num_imm = buf[pos++];

    for (size_t i = 0; i < m_num_imm; ++i) {
        vldec_u64(buf + pos, &pos);
        Variant::unpack(buf + pos, &pos, nullptr);
    }

    m_imm_len = pos - m_imm_pos;
    *inc += pos;
}